

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

void __thiscall chrono::ChArchiveOut::out<char,12ul>(ChArchiveOut *this,ChNameValue<char[12]> *bVal)

{
  size_t i;
  long lVar1;
  ChValueSpecific<char[12]> specVal;
  char buffer [20];
  char *local_98;
  char *local_90;
  undefined1 local_88;
  ChValueSpecific<char[12]> local_80;
  char local_48 [24];
  
  ChValueSpecific<char[12]>::ChValueSpecific(&local_80,bVal->_value,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])(this,&local_80,0xc);
  lVar1 = 0;
  do {
    sprintf(local_48,"%lu",lVar1);
    local_90 = *bVal->_value + lVar1;
    local_88 = 0;
    local_98 = local_48;
    (*(this->super_ChArchive)._vptr_ChArchive[6])(this,&local_98);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])(this,&local_80,0xc);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xc);
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,&local_80,0xc);
  local_80.super_ChValue._vptr_ChValue = (_func_int **)&PTR__ChValue_00158650;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.super_ChValue._name._M_dataplus._M_p != &local_80.super_ChValue._name.field_2) {
    operator_delete(local_80.super_ChValue._name._M_dataplus._M_p,
                    local_80.super_ChValue._name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void out     (ChNameValue<T[N]> bVal) {
          size_t arraysize = sizeof(bVal.value())/sizeof(T);
          ChValueSpecific<T[N]> specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre( specVal, arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< T > array_val(buffer, bVal.value()[i]);
              this->out (array_val);
              this->out_array_between(specVal, arraysize);
          }
          this->out_array_end(specVal, arraysize);
      }